

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O0

void __thiscall deqp::gls::RandomShaderProgram::refreshUniforms(RandomShaderProgram *this)

{
  ConstStridedValueAccess<64> local_60;
  ConstStridedValueAccess<1> local_50;
  StridedValueRead<1> local_40;
  const_reference local_30;
  UniformSlot *uniformSlot;
  VariableType *uniformType;
  Variable *uniformVar;
  RandomShaderProgram *pRStack_10;
  int uniformNdx;
  RandomShaderProgram *this_local;
  
  pRStack_10 = this;
  for (uniformVar._4_4_ = 0; uniformVar._4_4_ < this->m_numUnifiedUniforms;
      uniformVar._4_4_ = uniformVar._4_4_ + 1) {
    uniformType = &rsg::ShaderInput::getVariable(this->m_unifiedUniforms[uniformVar._4_4_])->m_type;
    uniformSlot = (UniformSlot *)rsg::Variable::getType((Variable *)uniformType);
    local_30 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                         (&(this->super_ShaderProgram).m_uniforms,(long)uniformVar._4_4_);
    rsg::ConstStridedValueAccess<1>::ConstStridedValueAccess
              (&local_50,(VariableType *)uniformSlot,(Scalar *)&local_30->value);
    local_40 = rsg::ConstStridedValueAccess<1>::value(&local_50);
    local_60 = (ConstStridedValueAccess<64>)
               rsg::ExecutionContext::getValue(&this->m_execCtx,(Variable *)uniformType);
    rsg::StridedValueAccess<64>::operator=((StridedValueAccess<64> *)&local_60,&local_40);
  }
  return;
}

Assistant:

void RandomShaderProgram::refreshUniforms (void) const
{
	DE_ASSERT(m_numUnifiedUniforms == (int)m_uniforms.size());

	for (int uniformNdx = 0; uniformNdx < m_numUnifiedUniforms; uniformNdx++)
	{
		const rsg::Variable*		uniformVar	= m_unifiedUniforms[uniformNdx]->getVariable();
		const rsg::VariableType&	uniformType	= uniformVar->getType();
		const sglr::UniformSlot&	uniformSlot	= m_uniforms[uniformNdx];

		m_execCtx.getValue(uniformVar) = rsg::ConstValueAccess(uniformType, (const rsg::Scalar*)&uniformSlot.value).value();
	}
}